

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.h
# Opt level: O0

StringVector * __thiscall
CoreML::Specification::DictVectorizer::mutable_stringtoindex(DictVectorizer *this)

{
  bool bVar1;
  StringVector *this_00;
  DictVectorizer *this_local;
  
  bVar1 = has_stringtoindex(this);
  if (!bVar1) {
    clear_Map(this);
    set_has_stringtoindex(this);
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->Map_).stringtoindex_ = this_00;
  }
  return (this->Map_).stringtoindex_;
}

Assistant:

inline ::CoreML::Specification::StringVector* DictVectorizer::mutable_stringtoindex() {
  if (!has_stringtoindex()) {
    clear_Map();
    set_has_stringtoindex();
    Map_.stringtoindex_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictVectorizer.stringToIndex)
  return Map_.stringtoindex_;
}